

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStringEq(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  uint32_t uVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  Type TVar5;
  undefined4 uVar6;
  
  if (type.id != 2) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xe9b,"Expression *wasm::TranslateToFuzzReader::makeStringEq(Type)");
  }
  this_00 = &this->random;
  uVar1 = Random::upTo(this_00,2);
  if (uVar1 != 0) {
    pEVar2 = makeTrappingRefUse(this,(HeapType)0x50);
    pEVar3 = makeTrappingRefUse(this,(HeapType)0x50);
    uVar6 = 1;
    goto LAB_00131998;
  }
  if (((byte)this->wasm[0x179] & 4) == 0) {
LAB_00131958:
    TVar5.id = 0x52;
  }
  else {
    uVar1 = Random::upTo(this_00,2);
    if (uVar1 != 0) goto LAB_00131958;
    TVar5.id = 0x50;
  }
  pEVar2 = make(this,TVar5);
  if (((byte)this->wasm[0x179] & 4) == 0) {
LAB_00131985:
    TVar5.id = 0x52;
  }
  else {
    uVar1 = Random::upTo(this_00,2);
    if (uVar1 != 0) goto LAB_00131985;
    TVar5.id = 0x50;
  }
  pEVar3 = make(this,TVar5);
  uVar6 = 0;
LAB_00131998:
  pEVar4 = (Expression *)MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x28,8)
  ;
  pEVar4->_id = StringEqId;
  (pEVar4->type).id = 0;
  *(undefined4 *)(pEVar4 + 1) = uVar6;
  pEVar4[1].type.id = (uintptr_t)pEVar2;
  *(Expression **)(pEVar4 + 2) = pEVar3;
  wasm::StringEq::finalize();
  return pEVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringEq(Type type) {
  assert(type == Type::i32);

  if (oneIn(2)) {
    auto* left = make(Type(HeapType::string, getNullability()));
    auto* right = make(Type(HeapType::string, getNullability()));
    return builder.makeStringEq(StringEqEqual, left, right);
  }

  // string.compare may trap if the either input is null.
  auto* left = makeTrappingRefUse(HeapType::string);
  auto* right = makeTrappingRefUse(HeapType::string);
  return builder.makeStringEq(StringEqCompare, left, right);
}